

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnbasedUnsizedIntegerLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnbasedUnsizedIntegerLiteral,slang::ast::Type_const&,slang::logic_t&,slang::SourceRange>
          (BumpAllocator *this,Type *args,logic_t *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  UnbasedUnsizedIntegerLiteral *pUVar1;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  undefined8 in_RSI;
  logic_t value;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  value.value = (uint8_t)((ulong)in_RSI >> 0x38);
  pUVar1 = (UnbasedUnsizedIntegerLiteral *)
           allocate((BumpAllocator *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sourceRange.endLoc = in_RDX;
  sourceRange.startLoc = in_RCX;
  slang::ast::UnbasedUnsizedIntegerLiteral::UnbasedUnsizedIntegerLiteral
            ((UnbasedUnsizedIntegerLiteral *)
             CONCAT17(*(undefined1 *)in_RDX,in_stack_ffffffffffffffd8),*(Type **)((long)in_RCX + 8),
             value,sourceRange);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }